

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_game.cpp
# Opt level: O0

long __thiscall cpp_client::Base_game::go(Base_game *this)

{
  bool bVar1;
  pointer this_00;
  type pbVar2;
  pointer pBVar3;
  type this_01;
  long lVar4;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  allocator local_2d1;
  string local_2d0 [32];
  undefined1 local_2b0 [16];
  string local_2a0 [32];
  undefined1 local_280 [16];
  string local_270 [32];
  undefined1 local_250 [16];
  string local_240 [32];
  undefined1 local_220 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  anon_class_8_1_3e8781ac local_140;
  anon_class_8_1_3e8781ac add_standard_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [39];
  allocator local_f1;
  string local_f0 [8];
  string to_send;
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> game_name;
  string local_70 [32];
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string alias;
  Base_game *this_local;
  
  (*(this->super_Delta_mergable)._vptr_Delta_mergable[10])();
  std::operator+((char *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "{\"event\": \"alias\", \"data\": \"");
  std::operator+(local_30,(char *)local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  Connection::send(&this->conn_,(int)local_30,__buf,in_RCX,in_R8D);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"named",&local_c9);
  handle_response((Base_game *)local_a8,(string *)this);
  this_00 = std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::operator->
                      ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)
                       local_a8);
  pbVar2 = Any::as<std::__cxx11::string>(this_00);
  std::__cxx11::string::string((string *)(local_a8 + 8),(string *)pbVar2);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f0,"{\"event\": \"play\", \"data\": {\"clientType\": \"c++\", \"playerIndex\": ",
             &local_f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if (this->player_index_ == -1) {
    std::__cxx11::string::operator+=(local_f0,"null,");
  }
  else {
    std::__cxx11::to_string((__cxx11 *)&add_standard_str,this->player_index_);
    std::operator+(local_118,(char *)&add_standard_str);
    std::__cxx11::string::operator+=(local_f0,(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)&add_standard_str);
  }
  local_140.to_send = (string *)local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"password",&local_161);
  go::anon_class_8_1_3e8781ac::operator()(&local_140,(string *)local_160,&this->password_);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"requestedSession",&local_189);
  go::anon_class_8_1_3e8781ac::operator()(&local_140,(string *)local_188,&this->session_);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"gameSettings",&local_1b1);
  go::anon_class_8_1_3e8781ac::operator()(&local_140,(string *)local_1b0,&this->game_settings_);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::operator+=(local_f0,"\"playerName\":\"");
  bVar1 = std::operator==(&this->name_,"");
  if (bVar1) {
    pBVar3 = std::unique_ptr<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>::
             operator->(&this->ai_);
    (**pBVar3->_vptr_Base_ai)(local_1d8);
    std::__cxx11::string::operator+=(local_f0,local_1d8);
    std::__cxx11::string::~string(local_1d8);
  }
  else {
    std::__cxx11::string::operator+=(local_f0,(string *)&this->name_);
  }
  std::operator+(local_220 + 8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\",\"gameName\":\"");
  std::operator+(local_1f8,local_220 + 8);
  std::__cxx11::string::operator+=(local_f0,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)(local_220 + 8));
  Connection::send(&this->conn_,(int)local_f0,__buf_00,in_RCX,in_R8D);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"lobbied",(allocator *)(local_250 + 0xf));
  handle_response((Base_game *)local_220,(string *)this);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)local_220);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)(local_250 + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"delta",(allocator *)(local_280 + 0xf));
  handle_response((Base_game *)local_250,(string *)this);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)(local_280 + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"start",(allocator *)(local_2b0 + 0xf));
  handle_response((Base_game *)local_280,(string *)this);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)(local_2b0 + 0xf));
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,"",&local_2d1);
    handle_response((Base_game *)local_2b0,(string *)this);
    this_01 = std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::operator*
                        ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)
                         local_2b0);
    bVar1 = Any::operator_cast_to_bool(this_01);
    std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
              ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)local_2b0);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  } while (bVar1);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  lVar4 = std::__cxx11::string::~string((string *)local_30);
  return lVar4;
}

Assistant:

void Base_game::go()
{
   //grab the name first (do this again to ensure proper server-side name)
   std::string alias = R"({"event": "alias", "data": ")" + get_game_name() + "\"}";
   conn_.send(alias);
   const auto game_name = handle_response("named")->as<std::string>();
   //start with the same thing each time
   std::string to_send = R"({"event": "play", "data": {"clientType": "c++", "playerIndex": )";
   //now fill in the details
   if(player_index_ == -1)
   {
      to_send += "null,";
   }
   else
   {
      to_send += std::to_string(player_index_) + ",";
   }
   const auto add_standard_str = [&to_send](const std::string& name, const std::string& to_add)
      {
         to_send += "\"" + name + "\":";
         if(to_add == "")
         {
            to_send += "null,";
         }
         else
         {
            to_send += "\"" + to_add + "\",";
         }
      };
   add_standard_str("password", password_);
   add_standard_str("requestedSession", session_);
   add_standard_str("gameSettings", game_settings_);
   to_send += R"("playerName":")";
   if(name_ == "")
   {
      to_send += ai_->get_name();
   }
   else
   {
      to_send += name_;
   }
   to_send += R"(","gameName":")" + game_name + R"("}})";
   conn_.send(to_send);
   //Expecting the "lobbied" message
   handle_response("lobbied");
   //Next the delta message will be received
   handle_response("delta");
   //Start should be next
   handle_response("start");
   //now just do normal handling of events
   while(*handle_response())
   {
      //Intentionally empty
   }
}